

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool rest_filter_header(any *context,HTTPRequest *req,string *strURIPart)

{
  string_view str;
  Span<const_std::byte> s;
  string_view str_00;
  string_view reply;
  string_view reply_00;
  string_view str_01;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  bool bVar1;
  bool bVar2;
  RESTResponseFormat RVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  BlockFilterIndex *pBVar6;
  ChainstateManager *pCVar7;
  CBlockIndex *in_RSI;
  long in_FS_OFFSET;
  optional<unsigned_long> oVar8;
  uint256 *header_2;
  vector<uint256,_std::allocator<uint256>_> *__range2_2;
  uint256 *header_1;
  vector<uint256,_std::allocator<uint256>_> *__range2_1;
  uint256 *header;
  vector<uint256,_std::allocator<uint256>_> *__range2;
  CBlockIndex *pindex_1;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *__range1;
  bool index_ready;
  CChain *active_chain;
  ChainstateManager *chainman;
  ChainstateManager *maybe_chainman;
  BlockFilterIndex *index;
  runtime_error *e;
  RESTResponseFormat rf;
  iterator __end2_2;
  iterator __begin2_2;
  iterator __end2_1;
  iterator __begin2_1;
  DataStream ssHeader_1;
  iterator __end2;
  iterator __begin2;
  DataStream ssHeader;
  iterator __end1;
  iterator __begin1;
  vector<uint256,_std::allocator<uint256>_> filter_headers;
  CBlockIndex *pindex;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> headers;
  BlockFilterType filtertype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uri_parts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  optional<unsigned_long> parsed_count;
  string strJSON;
  UniValue jsonHeaders;
  string strHex;
  string errmsg;
  uint256 filter_header;
  optional<uint256> block_hash;
  string raw_blockhash;
  string raw_count;
  string param;
  ChainstateManager *in_stack_fffffffffffff788;
  undefined6 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff796;
  undefined1 in_stack_fffffffffffff797;
  CBlockIndex *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7a0;
  VType in_stack_fffffffffffff7a4;
  int nStatus;
  undefined4 in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  byte *in_stack_fffffffffffff7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b8;
  HTTPRequest *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  UniValue *in_stack_fffffffffffff7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d0;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d8;
  CBlockIndex *this_00;
  string *in_stack_fffffffffffff7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e8;
  HTTPStatusCode HVar9;
  CBlockIndex *in_stack_fffffffffffff7f0;
  BlockFilterIndex *in_stack_fffffffffffff7f8;
  BaseIndex *in_stack_fffffffffffff800;
  int in_stack_fffffffffffff80c;
  HTTPRequest *in_stack_fffffffffffff810;
  size_type in_stack_fffffffffffff840;
  undefined6 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84e;
  undefined1 uVar10;
  bool local_5db;
  undefined1 local_5da [2];
  uint256 *local_5d8;
  uint256 *local_5d0;
  allocator<char> local_5c2;
  allocator<char> local_5c1 [17];
  uint256 *local_5b0;
  uint256 *local_5a8;
  undefined1 local_5a0 [54];
  allocator<char> local_56a;
  allocator<char> local_569;
  uint256 *local_568;
  uint256 *local_560;
  undefined1 local_558 [39];
  allocator<char> local_531;
  CBlockIndex **local_530;
  CBlockIndex **local_528;
  CBlockIndex *local_508;
  allocator<char> local_4e3 [2];
  allocator<char> local_4e1 [41];
  _Storage<unsigned_long,_true> local_4b8;
  undefined1 local_4b0;
  UniValue local_408 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 local_330 [808];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup(in_stack_fffffffffffff7c0);
  if (!bVar1) {
    local_5db = false;
    goto LAB_01259f9d;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
  RVar3 = ParseDataFormat((string *)in_stack_fffffffffffff800,(string *)in_stack_fffffffffffff7f8);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  str_00._M_str = (char *)in_stack_fffffffffffff7c8;
  str_00._M_len = (size_t)in_stack_fffffffffffff7c0;
  util::SplitString_abi_cxx11_(str_00,(char)(in_stack_fffffffffffff7a4 >> 0x18));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff788);
  if (sVar4 == 3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff798,
                 CONCAT17(in_stack_fffffffffffff797,
                          CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff798,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff797,
                        CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff798,
                 CONCAT17(in_stack_fffffffffffff797,
                          CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff798,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff797,
                        CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
LAB_01258a52:
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    str_01._M_str = (char *)in_stack_fffffffffffff7d8;
    str_01._M_len = (size_t)in_stack_fffffffffffff7d0;
    oVar8 = ToIntegral<unsigned_long>(str_01);
    local_4b8._M_value =
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_4b0 = oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional<unsigned_long>::has_value
                      ((optional<unsigned_long> *)in_stack_fffffffffffff788);
    if (((bVar1) &&
        (puVar5 = std::optional<unsigned_long>::operator*
                            ((optional<unsigned_long> *)in_stack_fffffffffffff788), *puVar5 != 0))
       && (puVar5 = std::optional<unsigned_long>::operator*
                              ((optional<unsigned_long> *)in_stack_fffffffffffff788),
          *puVar5 < 0x7d1)) {
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      str._M_len._4_4_ = in_stack_fffffffffffff7a4;
      str._M_len._0_4_ = in_stack_fffffffffffff7a0;
      str._M_str._0_4_ = in_stack_fffffffffffff7a8;
      str._M_str._4_4_ = in_stack_fffffffffffff7ac;
      uint256::FromHex(str);
      bVar1 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_fffffffffffff788);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff798,
                     CONCAT17(in_stack_fffffffffffff797,
                              CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
        bVar1 = BlockFilterTypeByName
                          ((string *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                           (BlockFilterType *)in_stack_fffffffffffff798);
        if (bVar1) {
          pBVar6 = GetBlockFilterIndex((BlockFilterType)((uint)in_stack_fffffffffffff7ac >> 0x18));
          if (pBVar6 == (BlockFilterIndex *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff798,
                         CONCAT17(in_stack_fffffffffffff797,
                                  CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
            HVar9 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
            std::operator+((char *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
            local_5db = RESTERR((HTTPRequest *)in_stack_fffffffffffff7f0,HVar9,
                                in_stack_fffffffffffff7e0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff788);
          }
          else {
            std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::vector
                      ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                       in_stack_fffffffffffff788);
            std::optional<unsigned_long>::operator*
                      ((optional<unsigned_long> *)in_stack_fffffffffffff788);
            std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::reserve
                      ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                       in_stack_fffffffffffff7c8,(size_type)in_stack_fffffffffffff7c0);
            pCVar7 = GetChainman((any *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
            if (pCVar7 == (ChainstateManager *)0x0) {
              local_5db = false;
            }
            else {
              MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                        ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff788);
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                         in_stack_fffffffffffff7c8,
                         (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff7c0,
                         (char *)in_stack_fffffffffffff7b8,(char *)in_stack_fffffffffffff7b0,
                         in_stack_fffffffffffff7ac,SUB41((uint)in_stack_fffffffffffff7a8 >> 0x18,0))
              ;
              ChainstateManager::ActiveChain(in_stack_fffffffffffff788);
              std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffff788);
              local_508 = node::BlockManager::LookupBlockIndex
                                    ((BlockManager *)
                                     CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                                     (uint256 *)
                                     CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
              while( true ) {
                uVar10 = false;
                if (local_508 != (CBlockIndex *)0x0) {
                  in_stack_fffffffffffff84e =
                       CChain::Contains((CChain *)in_stack_fffffffffffff798,
                                        (CBlockIndex *)
                                        CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          in_stack_fffffffffffff790)));
                  uVar10 = in_stack_fffffffffffff84e;
                }
                if ((bool)uVar10 == false) break;
                std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
                          ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                           in_stack_fffffffffffff798,
                           (value_type *)
                           CONCAT17(in_stack_fffffffffffff797,
                                    CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
                in_stack_fffffffffffff840 =
                     std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::size
                               ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *
                                )in_stack_fffffffffffff788);
                puVar5 = std::optional<unsigned_long>::operator*
                                   ((optional<unsigned_long> *)in_stack_fffffffffffff788);
                if (in_stack_fffffffffffff840 == *puVar5) break;
                local_508 = CChain::Next((CChain *)
                                         CONCAT44(in_stack_fffffffffffff7a4,
                                                  in_stack_fffffffffffff7a0),
                                         in_stack_fffffffffffff798);
              }
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                         in_stack_fffffffffffff788);
              bVar1 = BaseIndex::BlockUntilSyncedToCurrentChain(in_stack_fffffffffffff800);
              std::vector<uint256,_std::allocator<uint256>_>::vector
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff788);
              std::optional<unsigned_long>::operator*
                        ((optional<unsigned_long> *)in_stack_fffffffffffff788);
              std::vector<uint256,_std::allocator<uint256>_>::reserve
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff7c8,
                         (size_type)in_stack_fffffffffffff7c0);
              local_528 = (CBlockIndex **)
                          std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::
                          begin((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *
                                )CONCAT17(in_stack_fffffffffffff797,
                                          CONCAT16(in_stack_fffffffffffff796,
                                                   in_stack_fffffffffffff790)));
              local_530 = (CBlockIndex **)
                          std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::
                          end((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                              CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)
                                      ));
              while (bVar2 = __gnu_cxx::
                             operator==<const_CBlockIndex_**,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                                       ((__normal_iterator<const_CBlockIndex_**,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                                         *)in_stack_fffffffffffff798,
                                        (__normal_iterator<const_CBlockIndex_**,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                                         *)CONCAT17(in_stack_fffffffffffff797,
                                                    CONCAT16(in_stack_fffffffffffff796,
                                                             in_stack_fffffffffffff790))),
                    ((bVar2 ^ 0xffU) & 1) != 0) {
                __gnu_cxx::
                __normal_iterator<const_CBlockIndex_**,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                ::operator*((__normal_iterator<const_CBlockIndex_**,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                             *)in_stack_fffffffffffff788);
                uint256::uint256((uint256 *)in_stack_fffffffffffff788);
                bVar2 = BlockFilterIndex::LookupFilterHeader
                                  (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                                   (uint256 *)in_stack_fffffffffffff7e8);
                if (!bVar2) {
                  std::allocator<char>::allocator();
                  HVar9 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
                             (allocator<char> *)in_stack_fffffffffffff7c8);
                  std::allocator<char>::~allocator(&local_531);
                  if (bVar1) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff798,
                                 (char *)CONCAT17(in_stack_fffffffffffff797,
                                                  CONCAT16(in_stack_fffffffffffff796,
                                                           in_stack_fffffffffffff790)));
                  }
                  else {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff798,
                                 (char *)CONCAT17(in_stack_fffffffffffff797,
                                                  CONCAT16(in_stack_fffffffffffff796,
                                                           in_stack_fffffffffffff790)));
                  }
                  std::__cxx11::string::string
                            (in_stack_fffffffffffff7d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff7c8);
                  local_5db = RESTERR((HTTPRequest *)in_stack_fffffffffffff7f0,HVar9,
                                      in_stack_fffffffffffff7e0);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff788);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff788);
                  goto LAB_01259ef5;
                }
                std::vector<uint256,_std::allocator<uint256>_>::push_back
                          ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff798,
                           (value_type *)
                           CONCAT17(in_stack_fffffffffffff797,
                                    CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
                __gnu_cxx::
                __normal_iterator<const_CBlockIndex_**,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                ::operator++((__normal_iterator<const_CBlockIndex_**,_std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>_>
                              *)in_stack_fffffffffffff788);
              }
              if (RVar3 == BINARY) {
                memset(local_558,0,0x20);
                DataStream::DataStream((DataStream *)in_stack_fffffffffffff788);
                local_560 = (uint256 *)
                            std::vector<uint256,_std::allocator<uint256>_>::begin
                                      ((vector<uint256,_std::allocator<uint256>_> *)
                                       CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         in_stack_fffffffffffff790)));
                local_568 = (uint256 *)
                            std::vector<uint256,_std::allocator<uint256>_>::end
                                      ((vector<uint256,_std::allocator<uint256>_> *)
                                       CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         in_stack_fffffffffffff790)));
                while (bVar1 = __gnu_cxx::
                               operator==<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                         ((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                           *)in_stack_fffffffffffff798,
                                          (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                           *)CONCAT17(in_stack_fffffffffffff797,
                                                      CONCAT16(in_stack_fffffffffffff796,
                                                               in_stack_fffffffffffff790))),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  __gnu_cxx::
                  __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
                  operator*((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                             *)in_stack_fffffffffffff788);
                  DataStream::operator<<
                            ((DataStream *)in_stack_fffffffffffff798,
                             (uint256 *)
                             CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790))
                            );
                  __gnu_cxx::
                  __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
                  operator++((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                              *)in_stack_fffffffffffff788);
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
                           (allocator<char> *)in_stack_fffffffffffff7c8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
                           (allocator<char> *)in_stack_fffffffffffff7c8);
                HTTPRequest::WriteHeader
                          ((HTTPRequest *)
                           CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                           (string *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                           (string *)in_stack_fffffffffffff798);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::allocator<char>::~allocator(&local_56a);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::allocator<char>::~allocator(&local_569);
                std::span<const_std::byte,_18446744073709551615UL>::span<DataStream_&>
                          ((span<const_std::byte,_18446744073709551615UL> *)
                           in_stack_fffffffffffff798,
                           (DataStream *)
                           CONCAT17(in_stack_fffffffffffff797,
                                    CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
                reply_01._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffff848;
                reply_01._M_ptr = (pointer)in_stack_fffffffffffff840;
                reply_01._M_extent._M_extent_value._6_1_ = in_stack_fffffffffffff84e;
                reply_01._M_extent._M_extent_value._7_1_ = uVar10;
                HTTPRequest::WriteReply
                          (in_stack_fffffffffffff810,in_stack_fffffffffffff80c,reply_01);
                local_5db = true;
                DataStream::~DataStream((DataStream *)in_stack_fffffffffffff788);
              }
              else if (RVar3 == HEX) {
                memset(local_5a0,0,0x20);
                DataStream::DataStream((DataStream *)in_stack_fffffffffffff788);
                local_5a8 = (uint256 *)
                            std::vector<uint256,_std::allocator<uint256>_>::begin
                                      ((vector<uint256,_std::allocator<uint256>_> *)
                                       CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         in_stack_fffffffffffff790)));
                local_5b0 = (uint256 *)
                            std::vector<uint256,_std::allocator<uint256>_>::end
                                      ((vector<uint256,_std::allocator<uint256>_> *)
                                       CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         in_stack_fffffffffffff790)));
                while (bVar1 = __gnu_cxx::
                               operator==<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                         ((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                           *)in_stack_fffffffffffff798,
                                          (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                           *)CONCAT17(in_stack_fffffffffffff797,
                                                      CONCAT16(in_stack_fffffffffffff796,
                                                               in_stack_fffffffffffff790))),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  __gnu_cxx::
                  __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
                  operator*((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                             *)in_stack_fffffffffffff788);
                  DataStream::operator<<
                            ((DataStream *)in_stack_fffffffffffff798,
                             (uint256 *)
                             CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790))
                            );
                  __gnu_cxx::
                  __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
                  operator++((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                              *)in_stack_fffffffffffff788);
                }
                Span<const_std::byte>::Span<DataStream>
                          ((Span<const_std::byte> *)in_stack_fffffffffffff798,
                           (DataStream *)
                           CONCAT17(in_stack_fffffffffffff797,
                                    CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)),
                           in_stack_fffffffffffff788);
                s.m_size = (size_t)in_stack_fffffffffffff7b8;
                s.m_data = in_stack_fffffffffffff7b0;
                HexStr_abi_cxx11_(s);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                               (char *)in_stack_fffffffffffff798);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                this_00 = in_RSI;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00,(char *)in_stack_fffffffffffff7d0,
                           (allocator<char> *)in_stack_fffffffffffff7c8);
                __s = &local_5c2;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00,(char *)__s,(allocator<char> *)in_stack_fffffffffffff7c8);
                HTTPRequest::WriteHeader
                          ((HTTPRequest *)
                           CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                           (string *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                           (string *)in_stack_fffffffffffff798);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::allocator<char>::~allocator(&local_5c2);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::allocator<char>::~allocator(local_5c1);
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
                reply._M_str = (char *)in_RSI;
                reply._M_len = (size_t)in_stack_fffffffffffff7c0;
                HTTPRequest::WriteReply
                          ((HTTPRequest *)
                           CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                           in_stack_fffffffffffff7a4,reply);
                local_5db = true;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                DataStream::~DataStream((DataStream *)in_stack_fffffffffffff788);
              }
              else if (RVar3 == JSON) {
                val = &local_350;
                std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
                UniValue::UniValue((UniValue *)
                                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                                   in_stack_fffffffffffff7a4,(string *)in_stack_fffffffffffff798);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                local_5d0 = (uint256 *)
                            std::vector<uint256,_std::allocator<uint256>_>::begin
                                      ((vector<uint256,_std::allocator<uint256>_> *)
                                       CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         in_stack_fffffffffffff790)));
                local_5d8 = (uint256 *)
                            std::vector<uint256,_std::allocator<uint256>_>::end
                                      ((vector<uint256,_std::allocator<uint256>_> *)
                                       CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         in_stack_fffffffffffff790)));
                while (bVar1 = __gnu_cxx::
                               operator==<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                         ((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                           *)in_stack_fffffffffffff798,
                                          (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                           *)CONCAT17(in_stack_fffffffffffff797,
                                                      CONCAT16(in_stack_fffffffffffff796,
                                                               in_stack_fffffffffffff790))),
                      ((bVar1 ^ 0xffU) & 1) != 0) {
                  __gnu_cxx::
                  __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
                  operator*((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                             *)in_stack_fffffffffffff788);
                  base_blob<256u>::GetHex_abi_cxx11_
                            ((base_blob<256U> *)
                             CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
                  UniValue::
                  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            (in_stack_fffffffffffff7c8,val);
                  UniValue::push_back((UniValue *)
                                      CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                                      (UniValue *)in_stack_fffffffffffff798);
                  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff788);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff788);
                  __gnu_cxx::
                  __normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>::
                  operator++((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                              *)in_stack_fffffffffffff788);
                }
                UniValue::write_abi_cxx11_(local_408,(int)local_330,(void *)0x0,0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                               (char *)in_stack_fffffffffffff798);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
                           (allocator<char> *)in_stack_fffffffffffff7c8);
                this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5da;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
                           (allocator<char> *)in_stack_fffffffffffff7c8);
                HTTPRequest::WriteHeader
                          ((HTTPRequest *)this,
                           (string *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                           (string *)in_stack_fffffffffffff798);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::allocator<char>::~allocator((allocator<char> *)local_5da);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::allocator<char>::~allocator((allocator<char> *)(local_5da + 1));
                nStatus = (int)((ulong)in_RSI >> 0x20);
                std::__cxx11::string::operator_cast_to_basic_string_view(this);
                reply_00._M_str = (char *)in_stack_fffffffffffff7c8;
                reply_00._M_len = (size_t)val;
                HTTPRequest::WriteReply((HTTPRequest *)this,nStatus,reply_00);
                local_5db = true;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                UniValue::~UniValue((UniValue *)in_stack_fffffffffffff788);
              }
              else {
                AvailableDataFormatsString_abi_cxx11_();
                HVar9 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
                std::operator+((char *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_RSI);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                               (char *)in_RSI);
                local_5db = RESTERR((HTTPRequest *)in_stack_fffffffffffff7f0,HVar9,
                                    in_stack_fffffffffffff7e0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff788);
                in_stack_fffffffffffff798 = in_RSI;
              }
LAB_01259ef5:
              std::vector<uint256,_std::allocator<uint256>_>::~vector
                        ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffff798);
            }
            std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~vector
                      ((vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *)
                       in_stack_fffffffffffff798);
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff798,
                       CONCAT17(in_stack_fffffffffffff797,
                                CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
          HVar9 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
          std::operator+((char *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
          local_5db = RESTERR((HTTPRequest *)in_stack_fffffffffffff7f0,HVar9,
                              in_stack_fffffffffffff7e0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff788);
        }
      }
      else {
        std::operator+((char *)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
        local_5db = RESTERR((HTTPRequest *)in_stack_fffffffffffff7f0,
                            (HTTPStatusCode)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
                            in_stack_fffffffffffff7e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff788);
      }
    }
    else {
      HVar9 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
      tinyformat::format<unsigned_int,std::__cxx11::string>
                ((char *)in_stack_fffffffffffff7c8,(uint *)in_stack_fffffffffffff7c0,
                 in_stack_fffffffffffff7b8);
      local_5db = RESTERR((HTTPRequest *)in_stack_fffffffffffff7f0,HVar9,in_stack_fffffffffffff7e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff788);
    }
  }
  else {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff788);
    if (sVar4 == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff798,
                   CONCAT17(in_stack_fffffffffffff797,
                            CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff798,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff797,
                          CONCAT16(in_stack_fffffffffffff796,in_stack_fffffffffffff790)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
                 (allocator<char> *)in_stack_fffffffffffff7c8);
      HTTPRequest::GetQueryParameter
                ((HTTPRequest *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                 (string *)in_stack_fffffffffffff798);
      std::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff7c8,(char (*) [2])in_stack_fffffffffffff7c0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff788);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff788);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff788);
      std::allocator<char>::~allocator(local_4e1);
      goto LAB_01258a52;
    }
    std::allocator<char>::allocator();
    HVar9 = (HTTPStatusCode)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0,
               (allocator<char> *)in_stack_fffffffffffff7c8);
    local_5db = RESTERR((HTTPRequest *)in_stack_fffffffffffff7f0,HVar9,in_stack_fffffffffffff7e0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff788);
    std::allocator<char>::~allocator(local_4e3);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff788);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff788);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff798);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff788);
LAB_01259f9d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_5db;
}

Assistant:

static bool rest_filter_header(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req)) return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    std::vector<std::string> uri_parts = SplitString(param, '/');
    std::string raw_count;
    std::string raw_blockhash;
    if (uri_parts.size() == 3) {
        // deprecated path: /rest/blockfilterheaders/<filtertype>/<count>/<blockhash>
        raw_blockhash = uri_parts[2];
        raw_count = uri_parts[1];
    } else if (uri_parts.size() == 2) {
        // new path with query parameter: /rest/blockfilterheaders/<filtertype>/<blockhash>?count=<count>
        raw_blockhash = uri_parts[1];
        try {
            raw_count = req->GetQueryParameter("count").value_or("5");
        } catch (const std::runtime_error& e) {
            return RESTERR(req, HTTP_BAD_REQUEST, e.what());
        }
    } else {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/blockfilterheaders/<filtertype>/<blockhash>.<ext>?count=<count>");
    }

    const auto parsed_count{ToIntegral<size_t>(raw_count)};
    if (!parsed_count.has_value() || *parsed_count < 1 || *parsed_count > MAX_REST_HEADERS_RESULTS) {
        return RESTERR(req, HTTP_BAD_REQUEST, strprintf("Header count is invalid or out of acceptable range (1-%u): %s", MAX_REST_HEADERS_RESULTS, raw_count));
    }

    auto block_hash{uint256::FromHex(raw_blockhash)};
    if (!block_hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + raw_blockhash);
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(uri_parts[0], filtertype)) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Unknown filtertype " + uri_parts[0]);
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Index is not enabled for filtertype " + uri_parts[0]);
    }

    std::vector<const CBlockIndex*> headers;
    headers.reserve(*parsed_count);
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        CChain& active_chain = chainman.ActiveChain();
        const CBlockIndex* pindex{chainman.m_blockman.LookupBlockIndex(*block_hash)};
        while (pindex != nullptr && active_chain.Contains(pindex)) {
            headers.push_back(pindex);
            if (headers.size() == *parsed_count)
                break;
            pindex = active_chain.Next(pindex);
        }
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    std::vector<uint256> filter_headers;
    filter_headers.reserve(*parsed_count);
    for (const CBlockIndex* pindex : headers) {
        uint256 filter_header;
        if (!index->LookupFilterHeader(pindex, filter_header)) {
            std::string errmsg = "Filter not found.";

            if (!index_ready) {
                errmsg += " Block filters are still in the process of being indexed.";
            } else {
                errmsg += " This error is unexpected and indicates index corruption.";
            }

            return RESTERR(req, HTTP_NOT_FOUND, errmsg);
        }
        filter_headers.push_back(filter_header);
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssHeader{};
        for (const uint256& header : filter_headers) {
            ssHeader << header;
        }

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssHeader);
        return true;
    }
    case RESTResponseFormat::HEX: {
        DataStream ssHeader{};
        for (const uint256& header : filter_headers) {
            ssHeader << header;
        }

        std::string strHex = HexStr(ssHeader) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }
    case RESTResponseFormat::JSON: {
        UniValue jsonHeaders(UniValue::VARR);
        for (const uint256& header : filter_headers) {
            jsonHeaders.push_back(header.GetHex());
        }

        std::string strJSON = jsonHeaders.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}